

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep.c
# Opt level: O0

int MRIStepInnerStepper_AddForcing(MRIStepInnerStepper stepper,sunrealtype t,N_Vector f)

{
  double dVar1;
  double dVar2;
  undefined8 in_RSI;
  long in_RDI;
  double in_XMM0_Qa;
  int i;
  sunrealtype taui;
  sunrealtype tau;
  int local_34;
  double local_30;
  int local_4;
  
  if (in_RDI == 0) {
    arkProcessError((ARKodeMem)0x0,-0x16,0x1175,"MRIStepInnerStepper_AddForcing",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_mristep.c"
                    ,"Inner stepper memory is NULL");
    local_4 = -0x16;
  }
  else {
    **(undefined8 **)(in_RDI + 0x40) = 0x3ff0000000000000;
    **(undefined8 **)(in_RDI + 0x48) = in_RSI;
    dVar1 = *(double *)(in_RDI + 0x30);
    dVar2 = *(double *)(in_RDI + 0x38);
    local_30 = 1.0;
    for (local_34 = 0; local_34 < *(int *)(in_RDI + 0x20); local_34 = local_34 + 1) {
      *(double *)(*(long *)(in_RDI + 0x40) + (long)(local_34 + 1) * 8) = local_30;
      *(undefined8 *)(*(long *)(in_RDI + 0x48) + (long)(local_34 + 1) * 8) =
           *(undefined8 *)(*(long *)(in_RDI + 0x18) + (long)local_34 * 8);
      local_30 = ((in_XMM0_Qa - dVar1) / dVar2) * local_30;
    }
    N_VLinearCombination
              (*(int *)(in_RDI + 0x20) + 1,*(undefined8 *)(in_RDI + 0x40),
               *(undefined8 *)(in_RDI + 0x48),in_RSI);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int MRIStepInnerStepper_AddForcing(MRIStepInnerStepper stepper, sunrealtype t,
                                   N_Vector f)
{
  sunrealtype tau, taui;
  int i;

  if (stepper == NULL)
  {
    arkProcessError(NULL, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Inner stepper memory is NULL");
    return ARK_ILL_INPUT;
  }

  /* always append the constant forcing term */
  stepper->vals[0] = ONE;
  stepper->vecs[0] = f;

  /* compute normalized time tau and initialize tau^i */
  tau  = (t - stepper->tshift) / (stepper->tscale);
  taui = ONE;

  for (i = 0; i < stepper->nforcing; i++)
  {
    stepper->vals[i + 1] = taui;
    stepper->vecs[i + 1] = stepper->forcing[i];
    taui *= tau;
  }

  N_VLinearCombination(stepper->nforcing + 1, stepper->vals, stepper->vecs, f);

  return ARK_SUCCESS;
}